

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extensions.cc
# Opt level: O1

bool bssl::ssl_parse_client_hello_with_trailing_data(SSL *ssl,CBS *cbs,SSL_CLIENT_HELLO *out)

{
  uint8_t *puVar1;
  size_t sVar2;
  bool bVar3;
  int iVar4;
  CBS cipher_suites;
  CBS extensions;
  CBS compression_methods;
  CBS session_id;
  CBS random;
  CBS local_78;
  CBS local_68;
  CBS local_58;
  CBS local_48;
  CBS local_38;
  
  out->ssl = (SSL *)0x0;
  out->client_hello = (uint8_t *)0x0;
  out->extensions = (uint8_t *)0x0;
  out->extensions_len = 0;
  out->compression_methods = (uint8_t *)0x0;
  out->compression_methods_len = 0;
  out->cipher_suites = (uint8_t *)0x0;
  out->cipher_suites_len = 0;
  out->dtls_cookie = (uint8_t *)0x0;
  out->dtls_cookie_len = 0;
  out->session_id = (uint8_t *)0x0;
  out->session_id_len = 0;
  out->random = (uint8_t *)0x0;
  out->random_len = 0;
  out->client_hello_len = 0;
  *(undefined8 *)&out->version = 0;
  out->ssl = ssl;
  puVar1 = cbs->data;
  sVar2 = cbs->len;
  iVar4 = CBS_get_u16(cbs,&out->version);
  if ((((iVar4 == 0) || (iVar4 = CBS_get_bytes(cbs,&local_38,0x20), iVar4 == 0)) ||
      (iVar4 = CBS_get_u8_length_prefixed(cbs,&local_48), iVar4 == 0)) || (0x20 < local_48.len)) {
    iVar4 = 0x7a;
  }
  else {
    out->random = local_38.data;
    out->random_len = local_38.len;
    out->session_id = local_48.data;
    out->session_id_len = local_48.len;
    iVar4 = SSL_is_dtls(out->ssl);
    if (iVar4 == 0) {
      out->dtls_cookie = (uint8_t *)0x0;
      out->dtls_cookie_len = 0;
    }
    else {
      iVar4 = CBS_get_u8_length_prefixed(cbs,&local_78);
      if (iVar4 == 0) {
        ERR_put_error(0x10,0,0x83,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                      ,0x86);
        return false;
      }
      out->dtls_cookie = local_78.data;
      out->dtls_cookie_len = local_78.len;
    }
    iVar4 = CBS_get_u16_length_prefixed(cbs,&local_78);
    if (((iVar4 != 0) && ((local_78.len & 1) == 0 && 1 < local_78.len)) &&
       ((iVar4 = CBS_get_u8_length_prefixed(cbs,&local_58), iVar4 != 0 && (local_58.len != 0)))) {
      out->cipher_suites = local_78.data;
      out->cipher_suites_len = local_78.len;
      out->compression_methods = local_58.data;
      out->compression_methods_len = local_58.len;
      if (cbs->len == 0) {
        out->extensions = (uint8_t *)0x0;
        out->extensions_len = 0;
      }
      else {
        iVar4 = CBS_get_u16_length_prefixed(cbs,&local_68);
        if ((iVar4 == 0) || (bVar3 = tls1_check_duplicate_extensions(&local_68), !bVar3)) {
          iVar4 = 0xa8;
          goto LAB_002432b7;
        }
        out->extensions = local_68.data;
        out->extensions_len = local_68.len;
      }
      out->client_hello = puVar1;
      out->client_hello_len = sVar2 - cbs->len;
      return true;
    }
    iVar4 = 0x95;
  }
LAB_002432b7:
  ERR_put_error(0x10,0,0x83,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/extensions.cc"
                ,iVar4);
  return false;
}

Assistant:

bool ssl_parse_client_hello_with_trailing_data(const SSL *ssl, CBS *cbs,
                                               SSL_CLIENT_HELLO *out) {
  OPENSSL_memset(out, 0, sizeof(*out));
  out->ssl = const_cast<SSL *>(ssl);

  CBS copy = *cbs;
  CBS random, session_id;
  if (!CBS_get_u16(cbs, &out->version) ||
      !CBS_get_bytes(cbs, &random, SSL3_RANDOM_SIZE) ||
      !CBS_get_u8_length_prefixed(cbs, &session_id) ||
      CBS_len(&session_id) > SSL_MAX_SSL_SESSION_ID_LENGTH) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
    return false;
  }

  out->random = CBS_data(&random);
  out->random_len = CBS_len(&random);
  out->session_id = CBS_data(&session_id);
  out->session_id_len = CBS_len(&session_id);

  if (SSL_is_dtls(out->ssl)) {
    CBS cookie;
    if (!CBS_get_u8_length_prefixed(cbs, &cookie)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
      return false;
    }
    out->dtls_cookie = CBS_data(&cookie);
    out->dtls_cookie_len = CBS_len(&cookie);
  } else {
    out->dtls_cookie = nullptr;
    out->dtls_cookie_len = 0;
  }

  CBS cipher_suites, compression_methods;
  if (!CBS_get_u16_length_prefixed(cbs, &cipher_suites) ||
      CBS_len(&cipher_suites) < 2 || (CBS_len(&cipher_suites) & 1) != 0 ||
      !CBS_get_u8_length_prefixed(cbs, &compression_methods) ||
      CBS_len(&compression_methods) < 1) {
    OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
    return false;
  }

  out->cipher_suites = CBS_data(&cipher_suites);
  out->cipher_suites_len = CBS_len(&cipher_suites);
  out->compression_methods = CBS_data(&compression_methods);
  out->compression_methods_len = CBS_len(&compression_methods);

  // If the ClientHello ends here then it's valid, but doesn't have any
  // extensions.
  if (CBS_len(cbs) == 0) {
    out->extensions = nullptr;
    out->extensions_len = 0;
  } else {
    // Extract extensions and check it is valid.
    CBS extensions;
    if (!CBS_get_u16_length_prefixed(cbs, &extensions) ||
        !tls1_check_duplicate_extensions(&extensions)) {
      OPENSSL_PUT_ERROR(SSL, SSL_R_CLIENTHELLO_PARSE_FAILED);
      return false;
    }
    out->extensions = CBS_data(&extensions);
    out->extensions_len = CBS_len(&extensions);
  }

  out->client_hello = CBS_data(&copy);
  out->client_hello_len = CBS_len(&copy) - CBS_len(cbs);
  return true;
}